

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

int Exa_ManFindFanin(Exa_Man_t_conflict *p,int i,int k)

{
  int iVar1;
  int local_24;
  int local_20;
  int iVar;
  int Count;
  int j;
  int k_local;
  int i_local;
  Exa_Man_t_conflict *p_local;
  
  local_20 = 0;
  local_24 = -1;
  for (iVar = 0; iVar < p->nObjs; iVar = iVar + 1) {
    if (p->VarMarks[i][k][iVar] != 0) {
      iVar1 = sat_solver_var_value(p->pSat,p->VarMarks[i][k][iVar]);
      if (iVar1 != 0) {
        local_24 = iVar;
        local_20 = local_20 + 1;
      }
    }
  }
  if (local_20 == 1) {
    return local_24;
  }
  __assert_fail("Count == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                ,0x280,"int Exa_ManFindFanin(Exa_Man_t *, int, int)");
}

Assistant:

static inline int Exa_ManFindFanin( Exa_Man_t * p, int i, int k )
{
    int j, Count = 0, iVar = -1;
    for ( j = 0; j < p->nObjs; j++ )
        if ( p->VarMarks[i][k][j] && bmcg_sat_solver_read_cex_varvalue(p->pSat, p->VarMarks[i][k][j]) )
        {
            iVar = j;
            Count++;
        }
    assert( Count == 1 );
    return iVar;
}